

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

void Aig_ManRegManStop(Aig_ManPre_t *p)

{
  Vec_Flt_t *__ptr;
  
  Vec_VecFree((Vec_Vec_t *)p->vMatrix);
  if ((Vec_Vec_t *)p->vParts != (Vec_Vec_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vParts);
  }
  Vec_IntFree(p->vRegs);
  Vec_IntFree(p->vUniques);
  Vec_IntFree(p->vFreeVars);
  __ptr = p->vPartCost;
  free(__ptr->pArray);
  free(__ptr);
  if (p->pfUsedRegs != (char *)0x0) {
    free(p->pfUsedRegs);
    p->pfUsedRegs = (char *)0x0;
  }
  free(p->pfPartVars);
  free(p);
  return;
}

Assistant:

void Aig_ManRegManStop( Aig_ManPre_t * p )
{
    Vec_VecFree( (Vec_Vec_t *)p->vMatrix );
    if ( p->vParts )
        Vec_VecFree( (Vec_Vec_t *)p->vParts );
    Vec_IntFree( p->vRegs );
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vFreeVars );
    Vec_FltFree( p->vPartCost );
    ABC_FREE( p->pfUsedRegs );
    ABC_FREE( p->pfPartVars );
    ABC_FREE( p );
}